

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O1

int Test_SUNLinSolResid(SUNLinearSolver S,int myid)

{
  N_Vector p_Var1;
  int iVar2;
  
  p_Var1 = SUNLinSolResid(S);
  if (p_Var1 == (N_Vector)0x0) {
    printf(">>> FAILED test -- SUNLinSolResid returned NULL N_Vector on Proc %d \n",myid);
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    if (myid == 0) {
      puts("    PASSED test -- SUNLinSolResid");
      iVar2 = 0;
      if (print_time != 0) {
        printf("    SUNLinSolResid Time: %22.15e \n \n",0);
      }
    }
  }
  return iVar2;
}

Assistant:

int Test_SUNLinSolResid(SUNLinearSolver S, int myid)
{
  double start_time, stop_time;
  N_Vector resid;

  /* this test can fail if the function returns NULL */
  start_time = get_time();
  resid = SUNLinSolResid(S);
  stop_time = get_time();   

  /* this test can also fail if the return value is negative */
  if (resid == NULL){
    printf(">>> FAILED test -- SUNLinSolResid returned NULL N_Vector on Proc %d \n", 
           myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolResid\n");
    PRINT_TIME("    SUNLinSolResid Time: %22.15e \n \n", stop_time - start_time);
  }

  return(0);
}